

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O1

void __thiscall
TEST_GROUP_CppUTestGroupMinipointCounterTest::~TEST_GROUP_CppUTestGroupMinipointCounterTest
          (TEST_GROUP_CppUTestGroupMinipointCounterTest *this)

{
  pointer mem;
  
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMinipointCounterTest_001d9ce0;
  mem = (this->h).tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
        super__Vector_impl_data._M_start;
  if (mem != (pointer)0x0) {
    operator_delete(mem,(long)(this->h).tiles.
                              super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage - (long)mem);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&(this->h).melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector(&(this->h).pairs);
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->s).bonus_tiles._M_t);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST_GROUP(MinipointCounterTest)
{
	WiningState s;
	WiningHand h;
	MinipointCounter m { h, s };

	void addPair(Tile tile)
	{
		h.pairs.push_back(vector<Tile>{ tile, tile });
		h.last_tile = tile;
	}

	void addTriplet(Tile tile, bool is_open)
	{
		h.melds.push_back({ { tile, tile, tile }, is_open });
		h.last_tile = tile;
	}

	void addQuad(Tile tile, bool is_open)
	{
		h.melds.push_back({ { tile, tile, tile, tile }, is_open });
		h.last_tile = tile;
	}

	void addSequence(Tile tile, bool is_open)
	{
		auto next = NextTile()(tile);
		auto last = NextTile()(next);

		vector<Tile> tiles {
			tile,
			next,
			last,
		};
		h.melds.push_back({ tiles, is_open });
		h.last_tile = last;
	}

	void addNoPointHand()
	{
		addPair(Tile::SouthWind);
		addSequence(Tile::OneOfCharacters, false);
		addSequence(Tile::TwoOfCircles, false);
		addSequence(Tile::TwoOfBamboos, false);
		addSequence(Tile::SevenOfCharacters, false);
	}

	void addOpenNoPointHand()
	{
		// Terminal or honor in each set
		addPair(Tile::SouthWind);
		addSequence(Tile::OneOfCharacters, false);
		addSequence(Tile::OneOfCircles, true);
		addSequence(Tile::OneOfBamboos, true);
		addSequence(Tile::SevenOfCharacters, false);
	}

	void addOpenNoPointsHandWithoutPair()
	{
		addSequence(Tile::TwoOfCharacters, false);
		addSequence(Tile::TwoOfCircles, true);
		addSequence(Tile::TwoOfBamboos, true);
		addSequence(Tile::SevenOfCharacters, false);
	}

	void addOpenNoPointsHandWithoutOneMeld()
	{
		addPair(Tile::SouthWind);
		addSequence(Tile::TwoOfCircles, true);
		addSequence(Tile::TwoOfBamboos, true);
		addSequence(Tile::TwoOfCharacters, false);
	}
}